

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this,int qubit0,int qubit1,rotation_type *rot,
          bool fixed)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int local_2c;
  int local_28;
  int qubits [2];
  bool fixed_local;
  rotation_type *rot_local;
  int qubit1_local;
  int qubit0_local;
  QRotationGate2<std::complex<double>_> *this_local;
  
  qubits[0]._3_1_ = fixed;
  unique0x10000208 = rot;
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,(bool)(qubits[0]._3_1_ & 1));
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00759d10;
  uVar1 = *(undefined4 *)((long)&(stack0xffffffffffffffe0->angle_).cos_ + 4);
  uVar2 = *(undefined4 *)&(stack0xffffffffffffffe0->angle_).sin_;
  uVar3 = *(undefined4 *)((long)&(stack0xffffffffffffffe0->angle_).sin_ + 4);
  *(undefined4 *)&(this->rotation_).angle_.cos_ =
       *(undefined4 *)&(stack0xffffffffffffffe0->angle_).cos_;
  *(undefined4 *)((long)&(this->rotation_).angle_.cos_ + 4) = uVar1;
  *(undefined4 *)&(this->rotation_).angle_.sin_ = uVar2;
  *(undefined4 *)((long)&(this->rotation_).angle_.sin_ + 4) = uVar3;
  local_2c = qubit0;
  local_28 = qubit1;
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [6])(this,&local_2c);
  return;
}

Assistant:

QRotationGate2( const int qubit0 , const int qubit1 ,
                        const rotation_type& rot , const bool fixed = false )
        : rotation_( rot )
        , QAdjustable( fixed )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }